

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O1

size_t __thiscall HawkTracer::parser::EventKlassField::get_sizeof(EventKlassField *this)

{
  FieldTypeId FVar1;
  
  FVar1 = this->_type_id;
  if (8 < (long)(int)FVar1) {
    __assert_fail("is_numeric() || _type_id == FieldTypeId::POINTER",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/event_klass.cpp"
                  ,0x13,"size_t HawkTracer::parser::EventKlassField::get_sizeof() const");
  }
  if (FVar1 < STRING) {
    return *(size_t *)(&DAT_00112158 + (long)(int)FVar1 * 8);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/event_klass.cpp"
                ,0x21,"size_t HawkTracer::parser::EventKlassField::get_sizeof() const");
}

Assistant:

size_t EventKlassField::get_sizeof() const
{
    assert(is_numeric() || _type_id == FieldTypeId::POINTER);
    FieldType v;
#define GET_SIZE_VARIANT(type_id) case FieldTypeId::type_id: return sizeof(v.f_##type_id)
    switch (_type_id)
    {
    GET_SIZE_VARIANT(INT8);
    GET_SIZE_VARIANT(UINT8);
    GET_SIZE_VARIANT(INT16);
    GET_SIZE_VARIANT(UINT16);
    GET_SIZE_VARIANT(INT32);
    GET_SIZE_VARIANT(UINT32);
    GET_SIZE_VARIANT(INT64);
    GET_SIZE_VARIANT(UINT64);
    GET_SIZE_VARIANT(POINTER);
    default: assert(0); return 0;
    }
#undef GET_SIZE_VARIANT
}